

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_gc.c
# Opt level: O3

void l2_gc_increase_ref_count(l2_gc_list *gc_list_p,void *managed_mem_p)

{
  _l2_gc_mem_node *p_Var1;
  
  p_Var1 = gc_list_p->head_p;
  while( true ) {
    if (p_Var1 == (_l2_gc_mem_node *)0x0) {
      l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC);
    }
    if (p_Var1->managed_mem_p == managed_mem_p) break;
    p_Var1 = p_Var1->next;
  }
  p_Var1->ref_count = p_Var1->ref_count + 1;
  return;
}

Assistant:

void l2_gc_increase_ref_count(l2_gc_list *gc_list_p, void *managed_mem_p) {
    l2_gc_mem_node *gc_mem_node_p = l2_gc_get_mem_node(gc_list_p, managed_mem_p);
    if (!gc_mem_node_p) l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC, managed_mem_p);
    gc_mem_node_p->ref_count += 1;
}